

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_local_date_only<toml::type_config>
            (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  allocator<char> *__a;
  value_type *pvVar2;
  context<toml::type_config> *in_RDX;
  source_location *in_RDI;
  source_location src_3;
  int max_day;
  bool is_leap;
  value_type day;
  value_type month;
  value_type year;
  source_location src_2;
  source_location src_1;
  source_location src;
  result<int,_toml::detail::none_t> day_r;
  result<int,_toml::detail::none_t> month_r;
  result<int,_toml::detail::none_t> year_r;
  string str;
  region reg;
  local_date_format_info fmt;
  spec *spec;
  location first;
  source_location *in_stack_fffffffffffff138;
  source_location *in_stack_fffffffffffff140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff148;
  size_type in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff158;
  undefined2 in_stack_fffffffffffff15c;
  undefined1 in_stack_fffffffffffff15e;
  undefined1 in_stack_fffffffffffff15f;
  location *in_stack_fffffffffffff160;
  allocator<char> *in_stack_fffffffffffff170;
  char *in_stack_fffffffffffff178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  region *in_stack_fffffffffffff198;
  source_location in_stack_fffffffffffff1a0;
  location *in_stack_fffffffffffff1a8;
  region *in_stack_fffffffffffff1b0;
  region *in_stack_fffffffffffff1b8;
  source_location *this_00;
  local_date local_e2c [17];
  spec *in_stack_fffffffffffff218;
  location *in_stack_fffffffffffff230;
  sequence *in_stack_fffffffffffff238;
  allocator<char> local_d41 [57];
  string *in_stack_fffffffffffff2f8;
  source_location *in_stack_fffffffffffff300;
  string *in_stack_fffffffffffff308;
  allocator<char> local_ca1 [49];
  string *in_stack_fffffffffffff390;
  location *in_stack_fffffffffffff398;
  sequence *in_stack_fffffffffffff3a0;
  string *in_stack_fffffffffffff3a8;
  source_location local_c28 [2];
  anon_class_8_2_b1f90682 local_af0;
  int local_ae8;
  undefined1 local_ae1;
  undefined **local_ae0;
  int local_ad4;
  undefined **local_ad0;
  value_type local_ac4;
  undefined **local_ac0;
  value_type local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab1 [20];
  allocator<char> local_821 [656];
  allocator<char> local_591 [337];
  error_info local_440 [3];
  result<int,_toml::detail::none_t> local_2e8 [5];
  result<int,_toml::detail::none_t> local_2c0 [5];
  result<int,_toml::detail::none_t> local_298 [5];
  undefined4 local_270;
  allocator<char> local_269 [144];
  allocator<char> local_1d9 [369];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  location::location(in_stack_fffffffffffff160,
                     (location *)
                     CONCAT17(in_stack_fffffffffffff15f,
                              CONCAT16(in_stack_fffffffffffff15e,
                                       CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158)
                                      )));
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::local_date(in_stack_fffffffffffff218);
  sequence::scan(in_stack_fffffffffffff238,in_stack_fffffffffffff230);
  sequence::~sequence((sequence *)in_stack_fffffffffffff140);
  bVar1 = region::is_ok((region *)0x6817dc);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffff198);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff15f,
                        CONCAT16(in_stack_fffffffffffff15e,
                                 CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158))),
               in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
    from_string<int>(in_stack_fffffffffffff2f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff15f,
                        CONCAT16(in_stack_fffffffffffff15e,
                                 CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158))),
               in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
    from_string<int>(in_stack_fffffffffffff2f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff15f,
                        CONCAT16(in_stack_fffffffffffff15e,
                                 CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158))),
               in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
    from_string<int>(in_stack_fffffffffffff2f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
    bVar1 = result<int,_toml::detail::none_t>::is_err(local_298);
    if (bVar1) {
      region::region(in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
      source_location::source_location(this_00,in_stack_fffffffffffff1b8);
      region::~region((region *)in_stack_fffffffffffff140);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff15f,
                          CONCAT16(in_stack_fffffffffffff15e,
                                   CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158))),
                 in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
      std::operator+((char *)in_stack_fffffffffffff148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff140);
      std::operator+(in_stack_fffffffffffff148,&in_stack_fffffffffffff140->is_ok_);
      source_location::source_location(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170);
      make_error_info<>(in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                        in_stack_fffffffffffff2f8);
      err<toml::error_info>(local_440);
      result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
      ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                *)in_stack_fffffffffffff140,(failure_type *)in_stack_fffffffffffff138);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x681cb4);
      error_info::~error_info((error_info *)in_stack_fffffffffffff140);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140);
      std::allocator<char>::~allocator(local_591);
      source_location::~source_location(in_stack_fffffffffffff140);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140);
      local_270 = 1;
      source_location::~source_location(in_stack_fffffffffffff140);
    }
    else {
      bVar1 = result<int,_toml::detail::none_t>::is_err(local_2c0);
      if (bVar1) {
        region::region(in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
        source_location::source_location(this_00,in_stack_fffffffffffff1b8);
        region::~region((region *)in_stack_fffffffffffff140);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff15f,
                            CONCAT16(in_stack_fffffffffffff15e,
                                     CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158)))
                   ,in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
        std::operator+((char *)in_stack_fffffffffffff148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff140);
        std::operator+(in_stack_fffffffffffff148,&in_stack_fffffffffffff140->is_ok_);
        source_location::source_location(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170);
        make_error_info<>(in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                          in_stack_fffffffffffff2f8);
        err<toml::error_info>((error_info *)in_stack_fffffffffffff198);
        result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
        ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                  *)in_stack_fffffffffffff140,(failure_type *)in_stack_fffffffffffff138);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x682098);
        error_info::~error_info((error_info *)in_stack_fffffffffffff140);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
        std::allocator<char>::~allocator(local_821);
        source_location::~source_location(in_stack_fffffffffffff140);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140);
        local_270 = 1;
        source_location::~source_location(in_stack_fffffffffffff140);
      }
      else {
        bVar1 = result<int,_toml::detail::none_t>::is_err(local_2e8);
        if (bVar1) {
          region::region(in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
          source_location::source_location(this_00,in_stack_fffffffffffff1b8);
          region::~region((region *)in_stack_fffffffffffff140);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff15f,
                          CONCAT16(in_stack_fffffffffffff15e,
                                   CONCAT24(in_stack_fffffffffffff15c,in_stack_fffffffffffff158))),
                 in_stack_fffffffffffff150,(size_type)in_stack_fffffffffffff148);
          std::operator+((char *)in_stack_fffffffffffff148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff140);
          std::operator+(in_stack_fffffffffffff148,&in_stack_fffffffffffff140->is_ok_);
          source_location::source_location(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
          this = local_ab1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_stack_fffffffffffff178,in_stack_fffffffffffff170);
          make_error_info<>(in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                            in_stack_fffffffffffff2f8);
          err<toml::error_info>((error_info *)in_stack_fffffffffffff198);
          result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                    *)in_stack_fffffffffffff140,(failure_type *)in_stack_fffffffffffff138);
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x68238d);
          error_info::~error_info((error_info *)in_stack_fffffffffffff140);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff140);
          std::allocator<char>::~allocator((allocator<char> *)local_ab1);
          source_location::~source_location(in_stack_fffffffffffff140);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff140);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff140);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff140);
          local_270 = 1;
          source_location::~source_location(in_stack_fffffffffffff140);
        }
        else {
          local_ac0 = &PTR_s__workspace_llm4binary_github_lic_00933160;
          __a = (allocator<char> *)
                result<int,_toml::detail::none_t>::unwrap
                          ((result<int,_toml::detail::none_t> *)in_stack_fffffffffffff198,
                           in_stack_fffffffffffff1a0);
          local_ab8 = *(value_type *)__a;
          local_ad0 = &PTR_s__workspace_llm4binary_github_lic_00933178;
          pvVar2 = result<int,_toml::detail::none_t>::unwrap
                             ((result<int,_toml::detail::none_t> *)in_stack_fffffffffffff198,
                              in_stack_fffffffffffff1a0);
          local_ac4 = *pvVar2;
          local_ae0 = &PTR_s__workspace_llm4binary_github_lic_00933190;
          pvVar2 = result<int,_toml::detail::none_t>::unwrap
                             ((result<int,_toml::detail::none_t> *)in_stack_fffffffffffff198,
                              in_stack_fffffffffffff1a0);
          local_ad4 = *pvVar2;
          local_af0.is_leap = false;
          if (local_ab8 % 4 == 0) {
            local_af0.is_leap = local_ab8 % 100 != 0 || local_ab8 % 400 == 0;
          }
          local_af0.month = local_ac4;
          local_ae1 = local_af0.is_leap;
          local_ae8 = parse_local_date_only<toml::type_config>::anon_class_8_2_b1f90682::operator()
                                (&local_af0);
          if ((((local_ac4 < 1) || (0xc < local_ac4)) || (local_ad4 < 1)) || (local_ae8 < local_ad4)
             ) {
            region::region(in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
            source_location::source_location(this_00,in_stack_fffffffffffff1b8);
            region::~region((region *)in_stack_fffffffffffff140);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff180,in_stack_fffffffffffff178,__a);
            source_location::source_location(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff180,in_stack_fffffffffffff178,__a);
            make_error_info<>(in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                              in_stack_fffffffffffff2f8);
            in_stack_fffffffffffff140 = local_c28;
            err<toml::error_info>((error_info *)in_stack_fffffffffffff198);
            result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
            ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                      *)in_stack_fffffffffffff140,(failure_type *)in_stack_fffffffffffff138);
            failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6827bb);
            error_info::~error_info((error_info *)in_stack_fffffffffffff140);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff140);
            std::allocator<char>::~allocator(local_d41);
            source_location::~source_location(in_stack_fffffffffffff140);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff140);
            std::allocator<char>::~allocator(local_ca1);
            local_270 = 1;
            source_location::~source_location(in_stack_fffffffffffff140);
          }
          else {
            local_date::local_date(local_e2c,local_ab8,(char)local_ac4 - Feb,local_ad4);
            std::make_tuple<toml::local_date,toml::local_date_format_info,toml::detail::region>
                      ((local_date *)in_stack_fffffffffffff148,
                       (local_date_format_info *)in_stack_fffffffffffff140,
                       (region *)in_stack_fffffffffffff138);
            ok<std::tuple<toml::local_date,toml::local_date_format_info,toml::detail::region>>
                      ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                        *)in_stack_fffffffffffff1b8);
            result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
            ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                      *)in_stack_fffffffffffff140,(success_type *)in_stack_fffffffffffff138);
            success<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>_>
            ::~success((success<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>_>
                        *)0x68299d);
            std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>::~tuple
                      ((tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                        *)0x6829aa);
            local_270 = 1;
          }
        }
      }
    }
    result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x682a0a);
    result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x682a17);
    result<int,_toml::detail::none_t>::~result((result<int,_toml::detail::none_t> *)0x682a24);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170);
    syntax::local_date(in_stack_fffffffffffff218);
    location::location(in_stack_fffffffffffff160,
                       (location *)
                       CONCAT17(in_stack_fffffffffffff15f,
                                CONCAT16(in_stack_fffffffffffff15e,
                                         CONCAT24(in_stack_fffffffffffff15c,
                                                  in_stack_fffffffffffff158))));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
               in_stack_fffffffffffff390);
    err<toml::error_info>((error_info *)in_stack_fffffffffffff198);
    result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
    ::result((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)in_stack_fffffffffffff140,(failure_type *)in_stack_fffffffffffff138);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6818dc);
    error_info::~error_info((error_info *)in_stack_fffffffffffff140);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
    std::allocator<char>::~allocator(local_269);
    location::~location((location *)in_stack_fffffffffffff140);
    sequence::~sequence((sequence *)in_stack_fffffffffffff140);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff140);
    std::allocator<char>::~allocator(local_1d9);
    local_270 = 1;
  }
  region::~region((region *)in_stack_fffffffffffff140);
  location::~location((location *)in_stack_fffffffffffff140);
  return (result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
          *)in_RDI;
}

Assistant:

result<std::tuple<local_date, local_date_format_info, region>, error_info>
parse_local_date_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    local_date_format_info fmt;

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::local_date(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_local_date: "
            "invalid date: date must be like: 1234-05-06, yyyy-mm-dd.",
            syntax::local_date(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();

    // 0123456789
    // yyyy-mm-dd
    const auto year_r  = from_string<int>(str.substr(0, 4));
    const auto month_r = from_string<int>(str.substr(5, 2));
    const auto day_r   = from_string<int>(str.substr(8, 2));

    if(year_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read year `" + str.substr(0, 4) + "`",
            std::move(src), "here"));
    }
    if(month_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read month `" + str.substr(5, 2) + "`",
            std::move(src), "here"));
    }
    if(day_r.is_err())
    {
        auto src = source_location(region(first));
        return err(make_error_info("toml::parse_local_date: "
            "failed to read day `" + str.substr(8, 2) + "`",
            std::move(src), "here"));
    }

    const auto year  = year_r.unwrap();
    const auto month = month_r.unwrap();
    const auto day   = day_r.unwrap();

    {
        // We briefly check whether the input date is valid or not.
        //     Actually, because of the historical reasons, there are several
        // edge cases, such as 1582/10/5-1582/10/14 (only in several countries).
        // But here, we do not care about it.
        // It makes the code complicated and there is only low probability
        // that such a specific date is needed in practice. If someone need to
        // validate date accurately, that means that the one need a specialized
        // library for their purpose in another layer.

        const bool is_leap = (year % 4 == 0) && ((year % 100 != 0) || (year % 400 == 0));
        const auto max_day = [month, is_leap]() {
            if(month == 2)
            {
                return is_leap ? 29 : 28;
            }
            if(month == 4 || month == 6 || month == 9 || month == 11)
            {
                return 30;
            }
            return 31;
        }();

        if((month < 1 || 12 < month) || (day < 1 || max_day < day))
        {
            auto src = source_location(region(first));
            return err(make_error_info("toml::parse_local_date: invalid date.",
                std::move(src), "month must be 01-12, day must be any of "
                "01-28,29,30,31 depending on the month/year."));
        }
    }

    return ok(std::make_tuple(
            local_date(year, static_cast<month_t>(month - 1), day),
            std::move(fmt), std::move(reg)
        ));
}